

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.hpp
# Opt level: O0

void bits::test_radixsort<unsigned_long,unsigned_int,8u>
               (_func_uint32_t_unsigned_long_ptr_unsigned_long_ptr_uint_ptr_uint_ptr_uint32_t
                *radixsort)

{
  bool bVar1;
  code *in_RDI;
  ExpressionLhs<const_unsigned_int_&> EVar2;
  ResultBuilder __catchResult_2;
  ResultBuilder __catchResult_1;
  uint32_t i;
  uint32_t *indices_out;
  unsigned_long *keys_out;
  ResultBuilder __catchResult;
  uint32_t out;
  uint32_t indices [2] [8];
  unsigned_long keys_copy [8];
  unsigned_long keys [2] [8];
  type rng;
  uint64_t *in_stack_ffffffffffffebe8;
  undefined7 in_stack_ffffffffffffebf0;
  undefined1 in_stack_ffffffffffffebf7;
  uint64_t *in_stack_ffffffffffffebf8;
  mt19937_64 *in_stack_ffffffffffffec00;
  undefined1 *in_stack_ffffffffffffec10;
  undefined7 in_stack_ffffffffffffec18;
  undefined1 in_stack_ffffffffffffec1f;
  ResultBuilder *in_stack_ffffffffffffec20;
  undefined1 local_1388 [112];
  char *in_stack_ffffffffffffece8;
  Flags in_stack_ffffffffffffecf4;
  char *in_stack_ffffffffffffecf8;
  SourceLineInfo *in_stack_ffffffffffffed00;
  char *in_stack_ffffffffffffed08;
  ResultBuilder *in_stack_ffffffffffffed10;
  ResultBuilder local_1088;
  uint local_de4;
  undefined1 *local_de0;
  undefined1 *local_dd8;
  undefined4 local_dcc;
  ExpressionLhs<const_unsigned_int_&> local_dc8;
  ResultBuilder local_d80;
  uint local_adc;
  undefined1 local_ad8 [32];
  undefined1 auStack_ab8 [96];
  undefined1 local_a58 [64];
  undefined1 auStack_a18 [2576];
  code *local_8;
  
  local_8 = in_RDI;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)0x17fdcc);
  rand_keys(in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
            (uint32_t *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
            in_stack_ffffffffffffebe8,0);
  local_adc = (*local_8)(local_a58,auStack_a18,local_ad8,auStack_ab8,8);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)in_stack_ffffffffffffec20,
               (char *)CONCAT17(in_stack_ffffffffffffec1f,in_stack_ffffffffffffec18),
               (size_t)in_stack_ffffffffffffec10);
    Catch::ResultBuilder::ResultBuilder
              (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,
               in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf4,in_stack_ffffffffffffece8);
    Catch::SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x17fe90);
    EVar2 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)
                       CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                       (uint *)in_stack_ffffffffffffebe8);
    local_dcc = 2;
    local_dc8 = EVar2;
    Catch::ExpressionLhs<unsigned_int_const&>::operator<
              ((ExpressionLhs<const_unsigned_int_&> *)
               CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
               (int *)in_stack_ffffffffffffebe8);
    Catch::ResultBuilder::endExpression
              ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0));
    bVar1 = Catch::ResultBuilder::shouldDebugBreak(&local_d80);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)0x17ffce);
    Catch::ResultBuilder::~ResultBuilder
              ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0));
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  local_dd8 = local_a58 + (ulong)local_adc * 0x40;
  local_de0 = local_ad8 + (ulong)local_adc * 0x20;
  for (local_de4 = 1; local_de4 < 8; local_de4 = local_de4 + 1) {
    do {
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_ffffffffffffec20,
                 (char *)CONCAT17(in_stack_ffffffffffffec1f,in_stack_ffffffffffffec18),
                 (size_t)in_stack_ffffffffffffec10);
      Catch::ResultBuilder::ResultBuilder
                (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,
                 in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf4,in_stack_ffffffffffffece8);
      Catch::SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1800a4);
      Catch::ResultBuilder::operator<=
                ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                 in_stack_ffffffffffffebe8);
      in_stack_ffffffffffffec20 =
           Catch::ExpressionLhs<unsigned_long_const&>::operator<=
                     ((ExpressionLhs<const_unsigned_long_&> *)
                      CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                      in_stack_ffffffffffffebe8);
      Catch::ResultBuilder::endExpression
                ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0));
      in_stack_ffffffffffffec1f = Catch::ResultBuilder::shouldDebugBreak(&local_1088);
      if ((bool)in_stack_ffffffffffffec1f) {
        Catch::alwaysTrue();
      }
      Catch::ResultBuilder::react((ResultBuilder *)0x180201);
      Catch::ResultBuilder::~ResultBuilder
                ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0));
      bVar1 = Catch::isTrue(false);
    } while (bVar1);
    do {
      in_stack_ffffffffffffec10 = local_1388;
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_ffffffffffffec20,
                 (char *)CONCAT17(in_stack_ffffffffffffec1f,in_stack_ffffffffffffec18),
                 (size_t)in_stack_ffffffffffffec10);
      Catch::ResultBuilder::ResultBuilder
                (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00,
                 in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf4,in_stack_ffffffffffffece8);
      Catch::SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x18027b);
      Catch::ResultBuilder::operator<=
                ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                 in_stack_ffffffffffffebe8);
      Catch::ExpressionLhs<unsigned_long_const&>::operator==
                ((ExpressionLhs<const_unsigned_long_&> *)
                 CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0),
                 in_stack_ffffffffffffebe8);
      Catch::ResultBuilder::endExpression
                ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0));
      in_stack_ffffffffffffebf7 =
           Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)(local_1388 + 0x28));
      if ((bool)in_stack_ffffffffffffebf7) {
        Catch::alwaysTrue();
      }
      Catch::ResultBuilder::react((ResultBuilder *)0x1803d7);
      Catch::ResultBuilder::~ResultBuilder
                ((ResultBuilder *)CONCAT17(in_stack_ffffffffffffebf7,in_stack_ffffffffffffebf0));
      bVar1 = Catch::isTrue(false);
    } while (bVar1);
  }
  return;
}

Assistant:

void test_radixsort(uint32_t (*radixsort)(KeyType*, KeyType*, ValueType*, ValueType*, uint32_t))
{
    static const size_t array_size = N;
    typename RngType<KeyType>::type rng;
    KeyType keys[2][array_size];
    KeyType keys_copy[array_size];
    uint32_t indices[2][array_size];

    rand_keys(rng, keys[0], indices[0], keys_copy, array_size);
    auto out = radixsort(keys[0], keys[1], indices[0], indices[1], array_size);

    REQUIRE(out < 2);

    const KeyType* keys_out = keys[out];
    const uint32_t* indices_out = indices[out];

    for (uint32_t i = 1; i < array_size; ++i)
    {
        REQUIRE(keys_out[i - 1] <= keys_out[i]);
        REQUIRE(keys_out[i] == keys_copy[indices_out[i]]);
    }
}